

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
          (cbtCompoundLeafCallback *this,int index,cbtTransform *childTrans,
          cbtCollisionShape *childCollisionShape)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtScalar cVar8;
  ulong uVar9;
  cbtTransform *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  cbtCollisionObjectWrapper tmpObj;
  cbtCollisionObjectWrapper local_90;
  ConvexResultCallback local_68;
  ConvexResultCallback *local_50;
  int local_48;
  cbtTransform local_40;
  
  pcVar10 = this->m_colObjWorldTransform;
  fVar1 = (childTrans->m_basis).m_el[1].m_floats[2];
  cVar2 = (childTrans->m_basis).m_el[0].m_floats[2];
  cVar3 = (childTrans->m_basis).m_el[2].m_floats[2];
  cVar4 = (childTrans->m_origin).m_floats[2];
  fVar5 = (pcVar10->m_basis).m_el[0].m_floats[1];
  auVar16._4_4_ = fVar5;
  auVar16._0_4_ = fVar5;
  auVar16._8_4_ = fVar5;
  auVar16._12_4_ = fVar5;
  fVar6 = (pcVar10->m_basis).m_el[1].m_floats[1];
  auVar20._4_4_ = fVar6;
  auVar20._0_4_ = fVar6;
  auVar20._8_4_ = fVar6;
  auVar20._12_4_ = fVar6;
  fVar7 = (pcVar10->m_basis).m_el[2].m_floats[1];
  auVar23._4_4_ = fVar7;
  auVar23._0_4_ = fVar7;
  auVar23._8_4_ = fVar7;
  auVar23._12_4_ = fVar7;
  cVar8 = (pcVar10->m_basis).m_el[0].m_floats[0];
  auVar18._4_4_ = cVar8;
  auVar18._0_4_ = cVar8;
  auVar18._8_4_ = cVar8;
  auVar18._12_4_ = cVar8;
  cVar8 = (pcVar10->m_basis).m_el[1].m_floats[0];
  auVar21._4_4_ = cVar8;
  auVar21._0_4_ = cVar8;
  auVar21._8_4_ = cVar8;
  auVar21._12_4_ = cVar8;
  cVar8 = (pcVar10->m_basis).m_el[2].m_floats[0];
  auVar24._4_4_ = cVar8;
  auVar24._0_4_ = cVar8;
  auVar24._8_4_ = cVar8;
  auVar24._12_4_ = cVar8;
  cVar8 = (pcVar10->m_basis).m_el[0].m_floats[2];
  auVar19._4_4_ = cVar8;
  auVar19._0_4_ = cVar8;
  auVar19._8_4_ = cVar8;
  auVar19._12_4_ = cVar8;
  cVar8 = (pcVar10->m_basis).m_el[1].m_floats[2];
  auVar22._4_4_ = cVar8;
  auVar22._0_4_ = cVar8;
  auVar22._8_4_ = cVar8;
  auVar22._12_4_ = cVar8;
  cVar8 = (pcVar10->m_basis).m_el[2].m_floats[2];
  auVar25._4_4_ = cVar8;
  auVar25._0_4_ = cVar8;
  auVar25._8_4_ = cVar8;
  auVar25._12_4_ = cVar8;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar1)),ZEXT416((uint)cVar2),auVar18);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar6)),ZEXT416((uint)cVar2),auVar21);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar1)),auVar24,ZEXT416((uint)cVar2));
  cVar2 = (childTrans->m_origin).m_floats[0];
  auVar12 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar3),auVar19);
  auVar13 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar3),auVar22);
  auVar11 = vfmadd231ss_fma(auVar11,auVar25,ZEXT416((uint)cVar3));
  fVar1 = (childTrans->m_origin).m_floats[1];
  auVar14 = vmulss_avx512f(auVar20,ZEXT416((uint)fVar1));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar1)),ZEXT416((uint)cVar2),auVar18);
  auVar15 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)cVar2),auVar21);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar1)),auVar24,ZEXT416((uint)cVar2));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar4),auVar19);
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)cVar4),auVar22);
  auVar15 = vaddss_avx512f(auVar15,ZEXT416((uint)(pcVar10->m_origin).m_floats[1]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar25,ZEXT416((uint)cVar4));
  uVar9 = *(ulong *)(childTrans->m_basis).m_el[1].m_floats;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(childTrans->m_basis).m_el[2].m_floats;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar9;
  auVar16 = vmulps_avx512vl(auVar16,auVar27);
  auVar17 = vinsertps_avx(ZEXT416((uint)(auVar17._0_4_ + (pcVar10->m_origin).m_floats[0])),auVar15,
                          0x10);
  local_40.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar17,ZEXT416((uint)(auVar14._0_4_ + (pcVar10->m_origin).m_floats[2])),0x28);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(childTrans->m_basis).m_el[0].m_floats;
  local_90.m_worldTransform = &local_40;
  auVar17 = vfmadd231ps_fma(auVar16,auVar15,auVar18);
  auVar17 = vfmadd231ps_fma(auVar17,auVar26,auVar19);
  auVar14 = vmulps_avx512vl(auVar27,auVar20);
  auVar14 = vfmadd231ps_fma(auVar14,auVar15,auVar21);
  local_40.m_basis.m_el[0].m_floats._0_8_ = vmovlps_avx(auVar17);
  local_40.m_basis.m_el[0].m_floats[2] = auVar12._0_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar9;
  auVar17 = vmulps_avx512vl(auVar17,auVar23);
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  auVar17 = vfmadd231ps_fma(auVar17,auVar15,auVar24);
  auVar14 = vfmadd231ps_fma(auVar14,auVar26,auVar22);
  auVar17 = vfmadd231ps_fma(auVar17,auVar26,auVar25);
  local_40.m_basis.m_el[1].m_floats._0_8_ = vmovlps_avx(auVar14);
  local_40.m_basis.m_el[1].m_floats[2] = auVar13._0_4_;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats._0_8_ = vmovlps_avx(auVar17);
  local_40.m_basis.m_el[2].m_floats[2] = auVar11._0_4_;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_50 = this->m_resultCallback;
  local_68.m_collisionFilterGroup = 1;
  local_68.m_collisionFilterMask = -1;
  local_68._vptr_ConvexResultCallback = (_func_int **)&PTR__ConvexResultCallback_00b47fd8;
  local_68.m_closestHitFraction = local_50->m_closestHitFraction;
  local_90.m_parent = this->m_colObjWrap;
  local_90.m_collisionObject = (local_90.m_parent)->m_collisionObject;
  local_90.m_partId = -1;
  local_90.m_shape = childCollisionShape;
  local_90.m_index = index;
  local_48 = index;
  objectQuerySingleInternal
            (this->m_castShape,this->m_convexFromTrans,this->m_convexToTrans,&local_90,&local_68,
             this->m_allowedPenetration);
  return;
}

Assistant:

void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}